

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clzll.h
# Opt level: O0

uint32_t rapidjson::internal::clzll(uint64_t x)

{
  long lVar1;
  uint64_t x_local;
  
  if (x != 0) {
    lVar1 = 0x3f;
    if (x != 0) {
      for (; x >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    return (uint)lVar1 ^ 0x3f;
  }
  __assert_fail("x != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/../../include/rapidjson/internal/clzll.h"
                ,0x23,"uint32_t rapidjson::internal::clzll(uint64_t)");
}

Assistant:

inline uint32_t clzll(uint64_t x) {
    // Passing 0 to __builtin_clzll is UB in GCC and results in an
    // infinite loop in the software implementation.
    RAPIDJSON_ASSERT(x != 0);

#if defined(_MSC_VER)
    unsigned long r = 0;
#if defined(_WIN64)
    _BitScanReverse64(&r, x);
#else
    // Scan the high 32 bits.
    if (_BitScanReverse(&r, static_cast<uint32_t>(x >> 32)))
        return 63 - (r + 32);

    // Scan the low 32 bits.
    _BitScanReverse(&r, static_cast<uint32_t>(x & 0xFFFFFFFF));
#endif // _WIN64

    return 63 - r;
#elif (defined(__GNUC__) && __GNUC__ >= 4) || RAPIDJSON_HAS_BUILTIN(__builtin_clzll)
    // __builtin_clzll wrapper
    return static_cast<uint32_t>(__builtin_clzll(x));
#else
    // naive version
    uint32_t r;
    while (!(x & (static_cast<uint64_t>(1) << 63))) {
        x <<= 1;
        ++r;
    }

    return r;
#endif // _MSC_VER
}